

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedCopyImageCS::Run(AdvancedCopyImageCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int i;
  long lVar2;
  void *__s;
  ShaderImageLoadStoreBase *this_01;
  int i_1;
  int layers;
  allocator_type local_41;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  value_type local_28;
  
  lVar2 = 0;
  do {
    local_28.m_data[lVar2] = 7.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x79,&local_28,&local_41);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[0]);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8814,0xb,0xb);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,0xb,0xb,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8814,0xb,0xb);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture[0],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8814);
  layers = 0;
  glu::CallLogWrapper::glBindImageTexture(this_00,2,this->m_texture[1],0,'\0',0,35000,0x8814);
  __s = operator_new(0x790);
  memset(__s,0,0x790);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x790,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
  glu::CallLogWrapper::glUseProgram(this_00,this->c_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  this_01 = (ShaderImageLoadStoreBase *)
            glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  lVar2 = 0;
  do {
    local_28.m_data[lVar2] = 7.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  bVar1 = glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::
          CompareValues<tcu::Vector<float,4>>
                    (this_01,(Vector<float,_4> *)0xb,(int)&local_28,(Vector<float,_4> *)0x0,1,layers
                    );
  operator_delete(__s,0x790);
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		const int kSize = 11;

		std::vector<vec4> data(kSize * kSize, vec4(7.0f));
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, kSize, kSize);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, GL_RGBA, GL_FLOAT, &data[0]);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, kSize, kSize);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(3, m_texture[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(2, m_texture[1], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);

		std::vector<vec4> data_b(kSize * kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &data_b[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* map_data = (vec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);

		if (!CompareValues(map_data, kSize, vec4(7.f)))
			return ERROR;
		return NO_ERROR;
	}